

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_flattened_io_block(CompilerGLSL *this,SPIRVariable *var,char *qual)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  CompilerError *this_00;
  mapped_type *pmVar4;
  uint *puVar5;
  mapped_type *pmVar6;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_01;
  SPIRType *local_160;
  uint32_t local_13c;
  SPIRType *local_138;
  SPIRType *membertype;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end1;
  TypedID<(spirv_cross::Types)1> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range1;
  string local_108 [4];
  uint32_t i;
  string basename;
  uint local_e4;
  undefined1 local_e0 [8];
  SmallVector<unsigned_int,_8UL> member_indices;
  Bitset old_flags;
  SPIRType *type;
  allocator local_49;
  string local_48 [32];
  SPIRType *local_28;
  SPIRType *var_type;
  char *qual_local;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  var_type = (SPIRType *)qual;
  qual_local = (char *)var;
  var_local = (SPIRVariable *)this;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  local_28 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
  bVar2 = VectorView<unsigned_int>::empty(&(local_28->array).super_VectorView<unsigned_int>);
  if (!bVar2) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,
               "Array of varying structs cannot be flattened to legacy-compatible varyings.",
               &local_49);
    CompilerError::CompilerError(this_00,(string *)local_48);
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_28->type_alias);
  if (uVar3 == 0) {
    local_160 = local_28;
  }
  else {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_28->type_alias);
    local_160 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
  }
  this_01 = &(this->super_Compiler).ir.meta;
  pmVar4 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](this_01,&(local_160->super_IVariant).self);
  Bitset::Bitset((Bitset *)(member_indices.stack_storage.aligned_char + 0x18),
                 &(pmVar4->decoration).decoration_flags);
  pmVar4 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](this_01,&(local_160->super_IVariant).self);
  Bitset::set(&(pmVar4->decoration).decoration_flags,2);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_160->member_name_cache);
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)local_e0);
  local_e4 = 0;
  SmallVector<unsigned_int,_8UL>::push_back((SmallVector<unsigned_int,_8UL> *)local_e0,&local_e4);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(qual_local + 8));
  (*(this->super_Compiler)._vptr_Compiler[6])(local_108,this,(ulong)uVar3,1);
  __range1._4_4_ = 0;
  __begin1 = (TypedID<(spirv_cross::Types)1> *)&local_160->member_types;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin1);
  member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin1);
  for (; __end1 != member; __end1 = __end1 + 1) {
    membertype = (SPIRType *)__end1;
    add_member_name(this,local_160,__range1._4_4_);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)membertype);
    local_138 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
    uVar1 = __range1._4_4_;
    puVar5 = VectorView<unsigned_int>::back((VectorView<unsigned_int> *)local_e0);
    *puVar5 = uVar1;
    if (*(int *)&(local_138->super_IVariant).field_0xc == 0xf) {
      emit_flattened_io_block_struct
                (this,local_108,local_160,(char *)var_type,
                 (SmallVector<unsigned_int,_8UL> *)local_e0);
    }
    else {
      emit_flattened_io_block_member
                (this,local_108,local_160,(char *)var_type,
                 (SmallVector<unsigned_int,_8UL> *)local_e0);
    }
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  pmVar4 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(local_160->super_IVariant).self);
  Bitset::operator=(&(pmVar4->decoration).decoration_flags,
                    (Bitset *)(member_indices.stack_storage.aligned_char + 0x18));
  local_13c = TypedID::operator_cast_to_unsigned_int((TypedID *)(qual_local + 8));
  pmVar6 = ::std::
           unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
           ::operator[](&this->flattened_structs,&local_13c);
  *pmVar6 = true;
  ::std::__cxx11::string::~string((string *)local_108);
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_e0);
  Bitset::~Bitset((Bitset *)(member_indices.stack_storage.aligned_char + 0x18));
  return;
}

Assistant:

void CompilerGLSL::emit_flattened_io_block(const SPIRVariable &var, const char *qual)
{
	auto &var_type = get<SPIRType>(var.basetype);
	if (!var_type.array.empty())
		SPIRV_CROSS_THROW("Array of varying structs cannot be flattened to legacy-compatible varyings.");

	// Emit flattened types based on the type alias. Normally, we are never supposed to emit
	// struct declarations for aliased types.
	auto &type = var_type.type_alias ? get<SPIRType>(var_type.type_alias) : var_type;

	auto old_flags = ir.meta[type.self].decoration.decoration_flags;
	// Emit the members as if they are part of a block to get all qualifiers.
	ir.meta[type.self].decoration.decoration_flags.set(DecorationBlock);

	type.member_name_cache.clear();

	SmallVector<uint32_t> member_indices;
	member_indices.push_back(0);
	auto basename = to_name(var.self);

	uint32_t i = 0;
	for (auto &member : type.member_types)
	{
		add_member_name(type, i);
		auto &membertype = get<SPIRType>(member);

		member_indices.back() = i;
		if (membertype.basetype == SPIRType::Struct)
			emit_flattened_io_block_struct(basename, type, qual, member_indices);
		else
			emit_flattened_io_block_member(basename, type, qual, member_indices);
		i++;
	}

	ir.meta[type.self].decoration.decoration_flags = old_flags;

	// Treat this variable as fully flattened from now on.
	flattened_structs[var.self] = true;
}